

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_checkoption(lua_State *L,int narg,char *def,char **lst)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  if (def == (char *)0x0) {
    pcVar2 = luaL_checklstring(L,narg,(size_t *)0x0);
  }
  else {
    pcVar2 = luaL_optlstring(L,narg,def,(size_t *)0x0);
  }
  lVar3 = 0;
  while( true ) {
    if (lst[lVar3] == (char *)0x0) {
      pcVar2 = lua_pushfstring(L,"invalid option \'%s\'",pcVar2);
      iVar1 = luaL_argerror(L,narg,pcVar2);
      return iVar1;
    }
    iVar1 = strcmp(lst[lVar3],pcVar2);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
  }
  return (int)lVar3;
}

Assistant:

LUALIB_API int luaL_checkoption (lua_State *L, int narg, const char *def,
                                 const char *const lst[]) {
  const char *name = (def) ? luaL_optstring(L, narg, def) :
                             luaL_checkstring(L, narg);
  int i;
  for (i=0; lst[i]; i++)
    if (strcmp(lst[i], name) == 0)
      return i;
  return luaL_argerror(L, narg,
                       lua_pushfstring(L, "invalid option " LUA_QS, name));
}